

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_access_ptr(Integer g_a,Integer *lo,Integer *hi,void *ptr,Integer *ld)

{
  C_Integer *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  logical lVar5;
  size_t sVar6;
  ulong uVar7;
  C_Integer CVar8;
  Integer *pIVar9;
  global_array_t *pgVar10;
  long lVar11;
  ushort uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  Integer *pIVar18;
  long *plVar19;
  Integer ow;
  Integer _hi [7];
  Integer _lo [7];
  char err_string [256];
  long local_208;
  long local_200;
  long local_1f8;
  Integer *local_1f0;
  Integer *local_1e8;
  Integer local_1e0;
  long *local_1d8;
  long local_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [7];
  long alStack_180 [9];
  int local_138 [3];
  undefined1 uStack_129;
  undefined7 uStack_128;
  
  local_1f8 = g_a * 0x368;
  iVar4 = GA[g_a + 1000].p_handle;
  lVar15 = (long)iVar4;
  local_1e8 = hi;
  local_1e0 = g_a;
  local_1c8 = (long *)ptr;
  lVar5 = pnga_locate(g_a,lo,&local_208);
  if (lVar5 == 0) {
    pnga_error("locate top failed",0);
  }
  if (iVar4 != -1) {
    local_208 = (long)PGRP_LIST[lVar15].inv_map_proc_list[local_208];
  }
  iVar2 = armci_domain_id(0,(int)local_208);
  iVar3 = armci_domain_my_id(0);
  if ((iVar2 != iVar3) && (local_208 != GAme)) {
    pnga_error("cannot access top of the patch",local_208);
  }
  lVar5 = pnga_locate(local_1e0,local_1e8,&local_208);
  if (lVar5 == 0) {
    pnga_error("locate bottom failed",0);
  }
  if (iVar4 != -1) {
    local_208 = (long)PGRP_LIST[lVar15].inv_map_proc_list[local_208];
  }
  lVar17 = local_1e0 + 1000;
  local_1f0 = lo;
  local_1d0 = lVar15;
  iVar4 = armci_domain_id(0,(int)local_208);
  iVar2 = armci_domain_my_id(0);
  if ((iVar4 != iVar2) && (local_208 != GAme)) {
    pnga_error("cannot access bottom of the patch",local_208);
  }
  lVar15 = lVar17 * 0x368;
  uVar12 = GA[lVar17].ndim;
  lVar16 = (long)(short)uVar12;
  pIVar18 = local_1f0;
  local_200 = lVar15;
  local_1d8 = ld;
  if (lVar16 < 1) {
    pgVar10 = GA + lVar17;
  }
  else {
    lVar17 = 0;
    pIVar9 = local_1e8;
    lVar11 = lVar15;
    do {
      lVar15 = lVar11;
      if (pIVar9[lVar17] < pIVar18[lVar17]) {
        local_138._0_8_ = 0x6c20746f6e6e6163;
        stack0xfffffffffffffed0 = 0x7220657461636f;
        uStack_129 = 0x65;
        uStack_128 = 0x203a6e6f6967;
        local_1c0 = lVar17;
        strcpy((char *)((long)&uStack_128 + 6),GA->name + lVar11);
        sVar6 = strlen((char *)local_138);
        sprintf((char *)((long)local_138 + (long)(int)sVar6)," [%ld:%ld ",*pIVar18,*pIVar9);
        sVar6 = strlen((char *)local_138);
        pIVar9 = local_1e8;
        lVar15 = local_200;
        iVar4 = (int)sVar6;
        if (1 < *(short *)((long)GA->dims + lVar11 + -0x30)) {
          lVar17 = 1;
          do {
            sprintf((char *)((long)local_138 + (long)(int)sVar6),",%ld:%ld ",local_1f0[lVar17],
                    pIVar9[lVar17]);
            sVar6 = strlen((char *)local_138);
            iVar4 = (int)sVar6;
            lVar17 = lVar17 + 1;
          } while (lVar17 < *(short *)((long)GA->dims + lVar15 + -0x30));
        }
        *(undefined2 *)((long)local_138 + (long)iVar4) = 0x5d;
        pnga_error((char *)local_138,local_1e0);
        lVar17 = local_1c0;
        pIVar18 = local_1f0;
      }
      lVar17 = lVar17 + 1;
      uVar12 = *(ushort *)((long)GA->dims + lVar15 + -0x30);
      lVar16 = (long)(short)uVar12;
      lVar11 = lVar15;
    } while (lVar17 < lVar16);
    pgVar10 = (global_array_t *)((long)GA->dims + lVar15 + -0x30);
  }
  plVar19 = local_1d8;
  if (-1 < (int)local_1d0) {
    local_208 = (long)PGRP_LIST[local_1d0].map_proc_list[local_208];
  }
  if (0 < pgVar10->num_rstrctd) {
    local_208 = pgVar10->rank_rstrctd[local_208];
  }
  iVar4 = pgVar10->distr_type;
  if (iVar4 - 1U < 3) {
    uVar7 = (long)(int)local_208 % pgVar10->num_blocks[0];
    local_138[0] = (int)uVar7;
    if (1 < (short)uVar12) {
      uVar7 = uVar7 & 0xffffffff;
      lVar17 = 0;
      lVar15 = local_208;
      do {
        lVar15 = (long)((int)lVar15 - (int)uVar7) /
                 *(long *)((long)GA[1000].num_blocks + lVar17 * 8 + local_1f8);
        uVar7 = (long)(int)lVar15 %
                *(long *)((long)GA[1000].num_blocks + lVar17 * 8 + local_1f8 + 8);
        local_138[lVar17 + 1] = (int)uVar7;
        lVar17 = lVar17 + 1;
      } while ((ulong)(uint)(int)(short)uVar12 - 1 != lVar17);
    }
    if (0 < (short)uVar12) {
      lVar15 = 0;
      do {
        iVar4 = *(int *)((long)local_138 + lVar15);
        lVar17 = *(long *)((long)GA[1000].block_dims + lVar15 * 2 + local_1f8);
        *(long *)((long)alStack_180 + lVar15 * 2 + 8U) = lVar17 * iVar4 + 1;
        lVar17 = ((long)iVar4 + 1) * lVar17;
        *(long *)((long)local_1b8 + lVar15 * 2) = lVar17;
        lVar11 = *(long *)((long)GA[1000].dims + lVar15 * 2 + local_1f8);
        if (lVar11 <= lVar17) {
          lVar17 = lVar11;
        }
        *(long *)((long)local_1b8 + lVar15 * 2) = lVar17;
        lVar15 = lVar15 + 4;
      } while ((ulong)(uint)(int)(short)uVar12 << 2 != lVar15);
    }
    goto LAB_00208e38;
  }
  if (iVar4 == 4) {
    uVar7 = (long)(int)local_208 % pgVar10->num_blocks[0];
    local_138[0] = (int)uVar7;
    if (1 < (short)uVar12) {
      uVar7 = uVar7 & 0xffffffff;
      lVar11 = 0;
      lVar17 = local_208;
      do {
        lVar17 = (long)((int)lVar17 - (int)uVar7) /
                 *(long *)((long)GA[1000].num_blocks + lVar11 * 8 + local_1f8);
        uVar7 = (long)(int)lVar17 %
                *(long *)((long)GA[1000].num_blocks + lVar11 * 8 + local_1f8 + 8);
        local_138[lVar11 + 1] = (int)uVar7;
        lVar11 = lVar11 + 1;
      } while ((ulong)(uint)(int)(short)uVar12 - 1 != lVar11);
    }
    if (0 < (short)uVar12) {
      lVar15 = *(long *)(GA->name + lVar15 + -8);
      lVar17 = 0;
      iVar4 = 0;
      do {
        iVar2 = *(int *)((long)local_138 + lVar17);
        lVar11 = (long)iVar4 + (long)iVar2;
        *(undefined8 *)((long)alStack_180 + lVar17 * 2 + 8U) = *(undefined8 *)(lVar15 + lVar11 * 8);
        if ((long)iVar2 < *(long *)((long)pgVar10->num_blocks + lVar17 * 2) + -1) {
          lVar11 = pgVar10->mapc[lVar11 + 1] + -1;
        }
        else {
          lVar11 = *(long *)((long)pgVar10->dims + lVar17 * 2);
        }
        *(long *)((long)local_1b8 + lVar17 * 2) = lVar11;
        iVar4 = iVar4 + *(int *)((long)GA[1000].num_blocks + lVar17 * 2 + local_1f8);
        lVar17 = lVar17 + 4;
      } while ((ulong)(uint)(int)(short)uVar12 << 2 != lVar17);
    }
    goto LAB_00208e38;
  }
  if (iVar4 != 0) goto LAB_00208e38;
  if (pgVar10->num_rstrctd == 0) {
    if (lVar16 < 1) {
      lVar15 = 1;
    }
    else {
      lVar15 = 1;
      lVar17 = 0;
      do {
        lVar15 = lVar15 * *(int *)((long)GA[1000].nblock + lVar17 * 4 + local_1f8);
        lVar17 = lVar17 + 1;
      } while (lVar16 != lVar17);
    }
    if (-1 < local_208 && local_208 < lVar15) {
      if (0 < lVar16) {
        pCVar1 = pgVar10->mapc;
        lVar17 = 0;
        lVar11 = 0;
        lVar15 = local_208;
        do {
          lVar13 = (long)pgVar10->nblock[lVar17];
          lVar14 = lVar15 % lVar13;
          alStack_180[lVar17 + 1] = pCVar1[lVar14 + lVar11];
          if (lVar14 == lVar13 + -1) {
            CVar8 = pgVar10->dims[lVar17];
          }
          else {
            CVar8 = pCVar1[lVar14 + lVar11 + 1] + -1;
          }
          lVar11 = lVar11 + lVar13;
          local_1b8[lVar17] = CVar8;
          lVar17 = lVar17 + 1;
          lVar15 = lVar15 / lVar13;
        } while (lVar16 != lVar17);
      }
      goto LAB_00208e38;
    }
LAB_00208e07:
    if (lVar16 < 1) goto LAB_00208e38;
    sVar6 = lVar16 * 8;
  }
  else {
    if (local_208 < pgVar10->num_rstrctd) {
      if (lVar16 < 1) {
        lVar15 = 1;
      }
      else {
        lVar15 = 1;
        lVar17 = 0;
        do {
          lVar15 = lVar15 * *(int *)((long)GA[1000].nblock + lVar17 * 4 + local_1f8);
          lVar17 = lVar17 + 1;
        } while (lVar16 != lVar17);
      }
      if ((-1 < local_208) && (local_208 < lVar15)) {
        if (0 < lVar16) {
          pCVar1 = pgVar10->mapc;
          lVar17 = 0;
          lVar11 = 0;
          lVar15 = local_208;
          do {
            lVar13 = (long)pgVar10->nblock[lVar11];
            lVar14 = lVar15 % lVar13;
            alStack_180[lVar11 + 1] = pCVar1[lVar14 + lVar17];
            if (lVar14 == lVar13 + -1) {
              CVar8 = pgVar10->dims[lVar11];
            }
            else {
              CVar8 = pCVar1[lVar14 + lVar17 + 1] + -1;
            }
            lVar17 = lVar17 + lVar13;
            local_1b8[lVar11] = CVar8;
            lVar11 = lVar11 + 1;
            lVar15 = lVar15 / lVar13;
          } while (lVar16 != lVar11);
        }
        goto LAB_00208e38;
      }
      goto LAB_00208e07;
    }
    if ((short)uVar12 < 1) goto LAB_00208e38;
    sVar6 = (ulong)uVar12 << 3;
  }
  memset(alStack_180 + 1,0,sVar6);
  memset(local_1b8,0xff,sVar6);
LAB_00208e38:
  local_1f0 = (Integer *)lVar16;
  if (*(short *)((long)GA->dims + local_200 + -0x30) < 1) {
    local_200 = (long)GA->dims + local_200 + -0x30;
  }
  else {
    uVar7 = 0;
    do {
      lVar15 = pIVar18[uVar7];
      if ((lVar15 < alStack_180[uVar7 + 1]) || (local_1b8[uVar7] < lVar15)) {
        sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d",lVar15,
                alStack_180[uVar7 + 1],local_1b8[uVar7],uVar7 & 0xffffffff);
        pnga_error((char *)local_138,uVar7);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)*(short *)((long)GA->dims + local_200 + -0x30));
    local_200 = (long)GA->dims + local_200 + -0x30;
    plVar19 = local_1d8;
  }
  pgVar10 = GA;
  if (lVar16 == 1) {
    *plVar19 = (local_1b8[0] - alStack_180[1]) + *(long *)(local_200 + 0xc0) * 2 + 1;
  }
  if ((long)local_1f0 < 2) {
    lVar15 = 1;
    lVar17 = 0;
  }
  else {
    lVar15 = 1;
    lVar17 = 0;
    lVar11 = 0;
    do {
      lVar14 = *(long *)((long)pgVar10[1000].width + lVar11 * 8 + local_1f8);
      lVar17 = lVar17 + ((lVar14 + pIVar18[lVar11]) - alStack_180[lVar11 + 1]) * lVar15;
      lVar14 = ((lVar14 * 2 + 1) - alStack_180[lVar11 + 1]) + local_1b8[lVar11];
      plVar19[lVar11] = lVar14;
      lVar15 = lVar15 * lVar14;
      lVar11 = lVar11 + 1;
    } while (lVar16 + -1 != lVar11);
  }
  if (*(int *)(local_200 + 0x210) == 0) {
    local_208 = (long)PGRP_LIST->inv_map_proc_list[local_208];
  }
  else if (*(long *)(local_200 + 0x2a8) != 0) {
    local_208 = *(long *)(*(long *)(local_200 + 0x2a0) + local_208 * 8);
  }
  *local_1c8 = (long)*(int *)(local_200 + 0x18) *
               (((pIVar18[(long)local_1f0 + -1] - alStack_180[(long)local_1f0]) +
                *(long *)(local_200 + 0xb8 + (long)local_1f0 * 8)) * lVar15 + lVar17) +
               *(long *)(*(long *)(local_200 + 0x1e0) + local_208 * 8);
  return;
}

Assistant:

void pnga_access_ptr(Integer g_a, Integer lo[], Integer hi[],
                      void* ptr, Integer ld[])
{
char *lptr;
Integer  handle = GA_OFFSET + g_a;
Integer  ow,i,p_handle;

   
   p_handle = GA[handle].p_handle;
   if (!pnga_locate(g_a,lo,&ow)) pnga_error("locate top failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access top of the patch",ow);
   if (!pnga_locate(g_a,hi, &ow)) pnga_error("locate bottom failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme))
      pnga_error("cannot access bottom of the patch",ow);

   for (i=0; i<GA[handle].ndim; i++)
       if(lo[i]>hi[i]) {
           ga_RegionError(GA[handle].ndim, lo, hi, g_a);
       }

   if (p_handle >= 0) {
     ow = PGRP_LIST[p_handle].map_proc_list[ow];
   }
   if (GA[handle].num_rstrctd > 0) {
     ow = GA[handle].rank_rstrctd[ow];
   }
   gam_Location(ow,handle, lo, &lptr, ld);
   *(char**)ptr = lptr; 
}